

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_graph_context::build_pos_bias
          (llm_graph_context *this,ggml_tensor *pos_bucket,ggml_tensor *attn_rel_b)

{
  llm_graph_context *this_00;
  long lVar1;
  undefined8 uVar2;
  ggml_tensor *cur;
  undefined8 in_RDX;
  long in_RSI;
  char *in_RDI;
  ggml_tensor *pos_bias;
  ggml_tensor *pos_bucket_1d;
  int in_stack_ffffffffffffffcc;
  ggml_tensor *in_stack_ffffffffffffffd8;
  
  this_00 = (llm_graph_context *)
            ggml_reshape_1d(*(undefined8 *)(in_RDI + 0xc0),in_RSI,
                            *(long *)(in_RSI + 0x10) * *(long *)(in_RSI + 0x18));
  cb(this_00,in_stack_ffffffffffffffd8,in_RDI,in_stack_ffffffffffffffcc);
  lVar1 = ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),in_RDX,this_00);
  uVar2 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),lVar1,*(undefined8 *)(lVar1 + 0x10),
                          *(undefined8 *)(in_RSI + 0x10),*(undefined8 *)(in_RSI + 0x18));
  uVar2 = ggml_permute(*(undefined8 *)(in_RDI + 0xc0),uVar2,2,0,1,3);
  cur = (ggml_tensor *)ggml_cont(*(undefined8 *)(in_RDI + 0xc0),uVar2);
  cb(this_00,cur,in_RDI,in_stack_ffffffffffffffcc);
  return cur;
}

Assistant:

ggml_tensor * llm_graph_context::build_pos_bias(ggml_tensor * pos_bucket, ggml_tensor * attn_rel_b) const {
    ggml_tensor * pos_bucket_1d = ggml_reshape_1d(ctx0, pos_bucket, pos_bucket->ne[0] * pos_bucket->ne[1]);
    cb(pos_bucket_1d, "pos_bucket_1d", -1);

    ggml_tensor * pos_bias = ggml_get_rows(ctx0, attn_rel_b, pos_bucket_1d);

    pos_bias = ggml_reshape_3d(ctx0, pos_bias, pos_bias->ne[0], pos_bucket->ne[0], pos_bucket->ne[1]);
    pos_bias = ggml_permute   (ctx0, pos_bias, 2, 0, 1, 3);
    pos_bias = ggml_cont      (ctx0, pos_bias);

    cb(pos_bias, "pos_bias", -1);

    return pos_bias;
}